

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O0

int rsa_default_decrypt(RSA *rsa,size_t *out_len,uint8_t *out,size_t max_out,uint8_t *in,
                       size_t in_len,int padding)

{
  uint uVar1;
  int iVar2;
  int local_54;
  uint8_t *puStack_50;
  int ret;
  uint8_t *buf;
  uint rsa_size;
  size_t in_len_local;
  uint8_t *in_local;
  size_t max_out_local;
  uint8_t *out_local;
  size_t *out_len_local;
  RSA *rsa_local;
  
  uVar1 = RSA_size((RSA *)rsa);
  local_54 = 0;
  if (max_out < uVar1) {
    ERR_put_error(4,0,0x87,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0x1af);
    return 0;
  }
  puStack_50 = out;
  if ((padding == 3) ||
     (puStack_50 = (uint8_t *)OPENSSL_malloc((ulong)uVar1), puStack_50 != (uint8_t *)0x0)) {
    if (in_len == uVar1) {
      iVar2 = rsa_private_transform(rsa,puStack_50,in,(ulong)uVar1);
      if (iVar2 != 0) {
        if (padding == 1) {
          local_54 = rsa_padding_check_PKCS1_type_2
                               (out,out_len,(ulong)uVar1,puStack_50,(ulong)uVar1);
        }
        else if (padding == 3) {
          *out_len = (ulong)uVar1;
          local_54 = 1;
        }
        else {
          if (padding != 4) {
            ERR_put_error(4,0,0x8f,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                          ,0x1d5);
            goto LAB_0020a150;
          }
          local_54 = RSA_padding_check_PKCS1_OAEP_mgf1
                               (out,out_len,(ulong)uVar1,puStack_50,(ulong)uVar1,(uint8_t *)0x0,0,
                                (EVP_MD *)0x0,(EVP_MD *)0x0);
        }
        if (local_54 == 0) {
          ERR_put_error(4,0,0x88,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                        ,0x1db);
        }
      }
    }
    else {
      ERR_put_error(4,0,0x70,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                    ,0x1be);
    }
  }
LAB_0020a150:
  if (padding != 3) {
    OPENSSL_free(puStack_50);
  }
  return local_54;
}

Assistant:

static int rsa_default_decrypt(RSA *rsa, size_t *out_len, uint8_t *out,
                               size_t max_out, const uint8_t *in, size_t in_len,
                               int padding) {
  const unsigned rsa_size = RSA_size(rsa);
  uint8_t *buf = NULL;
  int ret = 0;

  if (max_out < rsa_size) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_OUTPUT_BUFFER_TOO_SMALL);
    return 0;
  }

  if (padding == RSA_NO_PADDING) {
    buf = out;
  } else {
    // Allocate a temporary buffer to hold the padded plaintext.
    buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(rsa_size));
    if (buf == NULL) {
      goto err;
    }
  }

  if (in_len != rsa_size) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_LEN_NOT_EQUAL_TO_MOD_LEN);
    goto err;
  }

  if (!rsa_private_transform(rsa, buf, in, rsa_size)) {
    goto err;
  }

  switch (padding) {
    case RSA_PKCS1_PADDING:
      ret =
          rsa_padding_check_PKCS1_type_2(out, out_len, rsa_size, buf, rsa_size);
      break;
    case RSA_PKCS1_OAEP_PADDING:
      // Use the default parameters: SHA-1 for both hashes and no label.
      ret = RSA_padding_check_PKCS1_OAEP_mgf1(out, out_len, rsa_size, buf,
                                              rsa_size, NULL, 0, NULL, NULL);
      break;
    case RSA_NO_PADDING:
      *out_len = rsa_size;
      ret = 1;
      break;
    default:
      OPENSSL_PUT_ERROR(RSA, RSA_R_UNKNOWN_PADDING_TYPE);
      goto err;
  }

  CONSTTIME_DECLASSIFY(&ret, sizeof(ret));
  if (!ret) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_PADDING_CHECK_FAILED);
  } else {
    CONSTTIME_DECLASSIFY(out, *out_len);
  }

err:
  if (padding != RSA_NO_PADDING) {
    OPENSSL_free(buf);
  }

  return ret;
}